

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::filldata<const_char16_t[19]>::fill(ostream *stream,char16_t (*in) [19])

{
  long lVar1;
  anon_union_24_2_13149d16_for_String_3 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  lVar1 = 0x13;
  do {
    if (lVar1 != 0x13) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
    }
    local_38.buf[0x17] = '\x14';
    local_38._0_4_ = 0x7d3f7b;
    doctest::operator<<(stream,(String *)&local_38.data);
    if ((local_38.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_38._4_4_,local_38._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_38._4_4_,local_38._0_4_));
    }
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return;
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }